

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

void Fra_BmcPerform(Fra_Man_t *p,int nPref,int nDepth)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Fra_Bmc_t *pFVar7;
  Aig_Man_t *pAVar8;
  void *pvVar9;
  abctime aVar10;
  abctime clk;
  int nImpsOld;
  int i;
  Aig_Obj_t *pObj;
  int nDepth_local;
  int nPref_local;
  Fra_Man_t *p_local;
  
  clk._0_4_ = 0;
  aVar6 = Abc_Clock();
  if (p->pBmc == (Fra_Bmc_t *)0x0) {
    pFVar7 = Fra_BmcStart(p->pManAig,nPref,nDepth);
    p->pBmc = pFVar7;
    pAVar8 = Fra_BmcFrames(p->pBmc,0);
    p->pBmc->pAigFrames = pAVar8;
    if (p->pCla->vImps != (Vec_Int_t *)0x0) {
      p->pBmc->pAigFrames->pImpFunc = Fra_BmcFilterImplications;
      p->pBmc->pAigFrames->pImpData = p->pBmc;
      p->pBmc->vImps = p->pCla->vImps;
      clk._0_4_ = Vec_IntSize(p->pCla->vImps);
    }
    pAVar8 = Fra_FraigEquivence(p->pBmc->pAigFrames,1000000,0);
    p->pBmc->pAigFraig = pAVar8;
    p->pBmc->pObjToFraig = p->pBmc->pAigFrames->pObjCopies;
    p->pBmc->pAigFrames->pObjCopies = (Aig_Obj_t **)0x0;
    for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->pBmc->pAigFrames->vObjs), clk._4_4_ < iVar1;
        clk._4_4_ = clk._4_4_ + 1) {
      pvVar9 = Vec_PtrEntry(p->pBmc->pAigFrames->vObjs,clk._4_4_);
      if (pvVar9 != (void *)0x0) {
        *(Fra_Man_t **)((long)pvVar9 + 0x28) = p;
      }
    }
    if (p->pPars->fVerbose != 0) {
      uVar2 = Aig_ManNodeNum(p->pBmc->pAig);
      uVar5 = p->pBmc->nFramesAll;
      uVar3 = Aig_ManNodeNum(p->pBmc->pAigFrames);
      uVar4 = Aig_ManNodeNum(p->pBmc->pAigFraig);
      printf("Original AIG = %d. Init %d frames = %d. Fraig = %d.  ",(ulong)uVar2,(ulong)uVar5,
             (ulong)uVar3,(ulong)uVar4);
      Abc_Print(1,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar6) * 1.0) / 1000000.0);
      printf("Before BMC: ");
      uVar5 = Vec_PtrSize(p->pCla->vClasses1);
      uVar2 = Vec_PtrSize(p->pCla->vClasses);
      uVar3 = Fra_ClassesCountLits(p->pCla);
      printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar5,(ulong)uVar2,(ulong)uVar3);
      if (p->pCla->vImps != (Vec_Int_t *)0x0) {
        printf("Imp = %5d. ",(ulong)(uint)clk);
      }
      printf("\n");
    }
    p->pCla->pFuncNodeIsConst = Fra_BmcNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_BmcNodesAreEqual;
    Fra_ClassesRefine(p->pCla);
    Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
    p->pCla->pFuncNodeIsConst = Fra_SmlNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    if (p->pPars->fVerbose != 0) {
      printf("After  BMC: ");
      uVar5 = Vec_PtrSize(p->pCla->vClasses1);
      uVar2 = Vec_PtrSize(p->pCla->vClasses);
      uVar3 = Fra_ClassesCountLits(p->pCla);
      printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar5,(ulong)uVar2,(ulong)uVar3);
      if (p->pCla->vImps != (Vec_Int_t *)0x0) {
        uVar5 = Vec_IntSize(p->pCla->vImps);
        printf("Imp = %5d. ",(ulong)uVar5);
      }
      printf("\n");
    }
    Fra_BmcStop(p->pBmc);
    p->pBmc = (Fra_Bmc_t *)0x0;
    return;
  }
  __assert_fail("p->pBmc == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraBmc.c"
                ,0x13c,"void Fra_BmcPerform(Fra_Man_t *, int, int)");
}

Assistant:

void Fra_BmcPerform( Fra_Man_t * p, int nPref, int nDepth )
{
    Aig_Obj_t * pObj;
    int i, nImpsOld = 0;
    abctime clk = Abc_Clock();
    assert( p->pBmc == NULL );
    // derive and fraig the frames
    p->pBmc = Fra_BmcStart( p->pManAig, nPref, nDepth );
    p->pBmc->pAigFrames = Fra_BmcFrames( p->pBmc, 0 );
    // if implications are present, configure the AIG manager to check them
    if ( p->pCla->vImps )
    {
        p->pBmc->pAigFrames->pImpFunc = (void (*) (void*, void*))Fra_BmcFilterImplications;
        p->pBmc->pAigFrames->pImpData = p->pBmc;
        p->pBmc->vImps = p->pCla->vImps;
        nImpsOld = Vec_IntSize(p->pCla->vImps);
    } 
    p->pBmc->pAigFraig = Fra_FraigEquivence( p->pBmc->pAigFrames, 1000000, 0 );
    p->pBmc->pObjToFraig = p->pBmc->pAigFrames->pObjCopies;
    p->pBmc->pAigFrames->pObjCopies = NULL;
    // annotate frames nodes with pointers to the manager
    Aig_ManForEachObj( p->pBmc->pAigFrames, pObj, i )
        pObj->pData = p;
    // report the results
    if ( p->pPars->fVerbose )
    {
        printf( "Original AIG = %d. Init %d frames = %d. Fraig = %d.  ", 
            Aig_ManNodeNum(p->pBmc->pAig), p->pBmc->nFramesAll, 
            Aig_ManNodeNum(p->pBmc->pAigFrames), Aig_ManNodeNum(p->pBmc->pAigFraig) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Before BMC: " );  
//        Fra_ClassesPrint( p->pCla, 0 );
        printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
            Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );
        if ( p->pCla->vImps )
            printf( "Imp = %5d. ", nImpsOld );
        printf( "\n" );
    }
    // refine the classes
    p->pCla->pFuncNodeIsConst   = Fra_BmcNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_BmcNodesAreEqual;
    Fra_ClassesRefine( p->pCla );
    Fra_ClassesRefine1( p->pCla, 1, NULL );
    p->pCla->pFuncNodeIsConst   = Fra_SmlNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    // report the results
    if ( p->pPars->fVerbose )
    {
        printf( "After  BMC: " );  
//        Fra_ClassesPrint( p->pCla, 0 );
        printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
            Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );
        if ( p->pCla->vImps )
            printf( "Imp = %5d. ", Vec_IntSize(p->pCla->vImps) );
        printf( "\n" );
    }
    // free the BMC manager
    Fra_BmcStop( p->pBmc );  
    p->pBmc = NULL;
}